

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,std::optional<supermap::ByteArray<3ul>>,supermap::ByteArray<3ul>>
          (ResultBuilder *this,optional<supermap::ByteArray<3UL>_> *lhs,ByteArray<3UL> *rhs)

{
  _Storage<supermap::ByteArray<3UL>,_false> _Var1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  bool bVar3;
  bool bVar4;
  ContextOptions *pCVar5;
  ByteArray<3UL> *in_R8;
  String SStack_38;
  
  if ((lhs->super__Optional_base<supermap::ByteArray<3UL>,_false,_false>)._M_payload.
      super__Optional_payload<supermap::ByteArray<3UL>,_true,_false,_false>.
      super__Optional_payload_base<supermap::ByteArray<3UL>_>._M_engaged == true) {
    _Var1 = (lhs->super__Optional_base<supermap::ByteArray<3UL>,_false,_false>)._M_payload.
            super__Optional_payload<supermap::ByteArray<3UL>,_true,_false,_false>.
            super__Optional_payload_base<supermap::ByteArray<3UL>_>._M_payload;
    _Var2._M_head_impl =
         (rhs->data_)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    bVar3 = *(char *)((long)_Var1 + 2) != (char)*(short *)(_Var2._M_head_impl + 2);
    bVar4 = *(short *)_Var1 != *(short *)_Var2._M_head_impl;
    (this->super_AssertData).m_failed = bVar3 || bVar4;
    if ((!bVar3 && !bVar4) && (pCVar5 = getContextOptions(), pCVar5->success == false)) {
      return;
    }
  }
  else {
    (this->super_AssertData).m_failed = true;
  }
  stringifyBinaryExpr<std::optional<supermap::ByteArray<3ul>>,supermap::ByteArray<3ul>>
            (&SStack_38,(detail *)lhs,(optional<supermap::ByteArray<3UL>_> *)0x1be8fa,(char *)rhs,
             in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }